

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall Lodtalk::AST::PragmaDefinition::~PragmaDefinition(PragmaDefinition *this)

{
  bool bVar1;
  reference ppNVar2;
  Node *param;
  iterator __end2;
  iterator __begin2;
  Parameters *__range2;
  PragmaDefinition *this_local;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__PragmaDefinition_0020cee8;
  __end2 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin
                     (&this->parameters);
  param = (Node *)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                            (&this->parameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Lodtalk::AST::Node_**,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                *)&param);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Lodtalk::AST::Node_**,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
              ::operator*(&__end2);
    if (*ppNVar2 != (Node *)0x0) {
      (*(*ppNVar2)->_vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<Lodtalk::AST::Node_**,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~vector
            (&this->parameters);
  std::__cxx11::string::~string((string *)&this->selector);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

PragmaDefinition::~PragmaDefinition()
{
    for(auto param : parameters)
        delete param;
}